

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recovery_test.cc
# Opt level: O2

void __thiscall leveldb::RecoveryTest::Open(RecoveryTest *this,Options *options)

{
  undefined1 local_1c0 [432];
  
  test::Tester::Tester
            ((Tester *)(local_1c0 + 0x10),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/recovery_test.cc"
             ,0x42);
  OpenWithStatus((RecoveryTest *)local_1c0,(Options *)this);
  test::Tester::IsOk((Tester *)(local_1c0 + 0x10),(Status *)local_1c0);
  Status::~Status((Status *)local_1c0);
  test::Tester::~Tester((Tester *)(local_1c0 + 0x10));
  test::Tester::Tester
            ((Tester *)(local_1c0 + 0x10),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/recovery_test.cc"
             ,0x43);
  local_1c0._0_4_ = 1;
  local_1c0._12_4_ = NumLogs(this);
  test::Tester::IsEq<int,int>
            ((Tester *)(local_1c0 + 0x10),(int *)local_1c0,(int *)(local_1c0 + 0xc));
  test::Tester::~Tester((Tester *)(local_1c0 + 0x10));
  return;
}

Assistant:

void Open(Options* options = nullptr) {
    ASSERT_OK(OpenWithStatus(options));
    ASSERT_EQ(1, NumLogs());
  }